

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O2

Vector3D * __thiscall
CGL::UniformHemisphereSampler3D::get_sample
          (Vector3D *__return_storage_ptr__,UniformHemisphereSampler3D *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar10 [16];
  
  dVar8 = random_uniform();
  dVar9 = random_uniform();
  dVar8 = acos(dVar8);
  fVar3 = (float)dVar8;
  fVar4 = sinf(fVar3);
  fVar5 = cosf((float)(dVar9 * 6.283185307179586));
  fVar6 = sinf(fVar3);
  fVar7 = sinf((float)(dVar9 * 6.283185307179586));
  fVar3 = cosf(fVar3);
  auVar1._4_4_ = extraout_XMM0_Db;
  auVar1._0_4_ = fVar4;
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._12_4_ = extraout_XMM0_Dd;
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)fVar6),0x10);
  auVar2._4_4_ = extraout_XMM0_Db_00;
  auVar2._0_4_ = fVar5;
  auVar2._8_4_ = extraout_XMM0_Dc_00;
  auVar2._12_4_ = extraout_XMM0_Dd_00;
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar7),0x10);
  auVar10._0_4_ = auVar1._0_4_ * auVar2._0_4_;
  auVar10._4_4_ = auVar1._4_4_ * auVar2._4_4_;
  auVar10._8_4_ = auVar1._8_4_ * auVar2._8_4_;
  auVar10._12_4_ = auVar1._12_4_ * auVar2._12_4_;
  auVar1 = vcvtps2pd_avx(auVar10);
  *(undefined1 (*) [16])(__return_storage_ptr__->field_0).field_2.__vec = auVar1;
  (__return_storage_ptr__->field_0).field_0.z = (double)fVar3;
  return __return_storage_ptr__;
}

Assistant:

Vector3D UniformHemisphereSampler3D::get_sample() const {

  double Xi1 = random_uniform();
  double Xi2 = random_uniform();

  double theta = acos(Xi1);
  double phi = 2.0 * PI * Xi2;

  double xs = sinf(theta) * cosf(phi);
  double ys = sinf(theta) * sinf(phi);
  double zs = cosf(theta);

  return Vector3D(xs, ys, zs);

}